

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xpath_text(lyxp_set **UNUSED_args,uint16_t UNUSED_arg_count,lyd_node *UNUSED_cur_node,
              lys_module *param_4,lyxp_set *set,int options)

{
  lyxp_node_type lVar1;
  ly_ctx *ctx;
  char *pcVar2;
  uint local_40;
  uint32_t i;
  int options_local;
  lyxp_set *set_local;
  lys_module *local_mod_local;
  lyd_node *UNUSED_cur_node_local;
  uint16_t UNUSED_arg_count_local;
  lyxp_set **UNUSED_args_local;
  
  if ((options & 0x1cU) == 0) {
    if (set->type == LYXP_SET_EMPTY) {
      UNUSED_args_local._4_4_ = 0;
    }
    else if (set->type == LYXP_SET_NODE_SET) {
      local_40 = 0;
      while (local_40 < set->used) {
        lVar1 = (set->val).nodes[local_40].type;
        if (lVar1 < LYXP_NODE_ELEM) {
LAB_001bf2f0:
          set_remove_node(set,local_40);
        }
        else if (lVar1 == LYXP_NODE_ELEM) {
          if ((((set->val).nodes[local_40].node)->validity & 0x80) != 0) {
            ly_vlog(param_4->ctx,LYE_XPATH_DUMMY,LY_VLOG_LYD,(set->val).nodes[local_40].node,
                    ((set->val).nodes[local_40].node)->schema->name);
            return -1;
          }
          if (((((set->val).nodes[local_40].node)->schema->nodetype & (LYS_LEAFLIST|LYS_LEAF)) ==
               LYS_UNKNOWN) || (((set->val).nodes[local_40].node)->ht == (hash_table *)0x0))
          goto LAB_001bf2f0;
          (set->val).nodes[local_40].type = LYXP_NODE_TEXT;
          local_40 = local_40 + 1;
        }
        else if (lVar1 - LYXP_NODE_TEXT < 2) goto LAB_001bf2f0;
      }
      UNUSED_args_local._4_4_ = 0;
    }
    else {
      ctx = param_4->ctx;
      pcVar2 = print_set_type(set);
      ly_vlog(ctx,LYE_XPATH_INCTX,LY_VLOG_NONE,(void *)0x0,pcVar2,"text()");
      UNUSED_args_local._4_4_ = -1;
    }
  }
  else {
    set_snode_clear_ctx(set);
    UNUSED_args_local._4_4_ = 0;
  }
  return UNUSED_args_local._4_4_;
}

Assistant:

static int
xpath_text(struct lyxp_set **UNUSED(args), uint16_t UNUSED(arg_count), struct lyd_node *UNUSED(cur_node),
           struct lys_module *local_mod, struct lyxp_set *set, int options)
{
    uint32_t i;

    if (options & LYXP_SNODE_ALL) {
        set_snode_clear_ctx(set);
        return EXIT_SUCCESS;
    }

    if (set->type == LYXP_SET_EMPTY) {
        return EXIT_SUCCESS;
    }
    if (set->type != LYXP_SET_NODE_SET) {
        LOGVAL(local_mod->ctx, LYE_XPATH_INCTX, LY_VLOG_NONE, NULL, print_set_type(set), "text()");
        return -1;
    }

    for (i = 0; i < set->used;) {
        switch (set->val.nodes[i].type) {
        case LYXP_NODE_ELEM:
            if (set->val.nodes[i].node->validity & LYD_VAL_INUSE) {
                LOGVAL(local_mod->ctx, LYE_XPATH_DUMMY, LY_VLOG_LYD, set->val.nodes[i].node, set->val.nodes[i].node->schema->name);
                return -1;
            }
            if ((set->val.nodes[i].node->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST))
                    && ((struct lyd_node_leaf_list *)set->val.nodes[i].node)->value_str) {
                set->val.nodes[i].type = LYXP_NODE_TEXT;
                ++i;
                break;
            }
            /* fall through */
        case LYXP_NODE_ROOT:
        case LYXP_NODE_ROOT_CONFIG:
        case LYXP_NODE_TEXT:
        case LYXP_NODE_ATTR:
            set_remove_node(set, i);
            break;
        }
    }

    return EXIT_SUCCESS;
}